

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

string * wasm::String::trim(string *__return_storage_ptr__,string *input)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  undefined8 local_20;
  size_t size;
  string *input_local;
  
  local_20 = std::__cxx11::string::size();
  while( true ) {
    bVar3 = false;
    if (local_20 != 0) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
      iVar1 = isspace((int)*pcVar2);
      bVar3 = true;
      if (iVar1 == 0) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
        bVar3 = *pcVar2 == '\0';
      }
    }
    if (!bVar3) break;
    local_20 = local_20 + -1;
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)input);
  return __return_storage_ptr__;
}

Assistant:

inline std::string trim(const std::string& input) {
  size_t size = input.size();
  while (size > 0 && (isspace(input[size - 1]) || input[size - 1] == '\0')) {
    size--;
  }
  return input.substr(0, size);
}